

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

int __thiscall
capnp::TwoPartyServer::accept(TwoPartyServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> connectionState;
  Promise<void> promise;
  undefined8 *local_28;
  long local_20;
  Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> local_18;
  
  local_18.disposer = (Disposer *)&kj::NullDisposer::instance;
  local_18.ptr = (AcceptedConnection *)__addr;
  kj::
  heap<capnp::TwoPartyServer::AcceptedConnection,capnp::TwoPartyServer&,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
            ((kj *)&local_28,(TwoPartyServer *)CONCAT44(in_register_00000034,__fd),
             (Own<kj::AsyncIoStream,_std::nullptr_t> *)&local_18);
  kj::Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&local_18);
  kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_18);
  kj::Promise<void>::attach<kj::Own<capnp::TwoPartyServer::AcceptedConnection,decltype(nullptr)>>
            ((Promise<void> *)this,&local_18);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_18);
  if (local_20 != 0) {
    local_20 = 0;
    (**(code **)*local_28)();
  }
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::accept(kj::AsyncIoStream& connection) {
  auto connectionState = kj::heap<AcceptedConnection>(*this,
      kj::Own<kj::AsyncIoStream>(&connection, kj::NullDisposer::instance));

  // Run the connection until disconnect.
  auto promise = connectionState->network.onDisconnect();
  return promise.attach(kj::mv(connectionState));
}